

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadTuple.h
# Opt level: O0

void __thiscall QuadTuple::QuadTuple(QuadTuple *this,string *o,string *n1,string *n2,string *r)

{
  string *r_local;
  string *n2_local;
  string *n1_local;
  string *o_local;
  QuadTuple *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->name1);
  std::__cxx11::string::string((string *)&this->name2);
  std::__cxx11::string::string((string *)&this->res);
  std::__cxx11::string::operator=((string *)this,(string *)o);
  std::__cxx11::string::operator=((string *)&this->name1,(string *)n1);
  std::__cxx11::string::operator=((string *)&this->name2,(string *)n2);
  std::__cxx11::string::operator=((string *)&this->res,(string *)r);
  return;
}

Assistant:

QuadTuple(string o,  string n1, string n2, string r) {
        op = o;
        name1 = n1;
        name2 = n2;
        res = r;

    }